

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O0

Option<Kernel::PolyNf> * __thiscall
Inferences::PolynomialEvaluation::evaluate(PolynomialEvaluation *this,PolyNf *normalized)

{
  int iVar1;
  PolyNf *in_RDX;
  BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_std::tuple<>,_Lib::ReturnNone<Kernel::PolyNf>,_Lib::Memo::None<Kernel::PolyNf,_Kernel::PolyNf>,_std::tuple<>_>
  *in_RDI;
  PolyNf out;
  Option<Kernel::PolyNf> *outOpt;
  PolyNf *in_stack_00000260;
  BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
  *in_stack_00000268;
  PolyNf *in_stack_ffffffffffffff68;
  MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool condition;
  anon_class_8_1_ba1d6aae in_stack_ffffffffffffff98;
  
  if ((evaluate(Kernel::PolyNf)::memo == '\0') &&
     (iVar1 = __cxa_guard_acquire(&evaluate(Kernel::PolyNf)::memo), iVar1 != 0)) {
    MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::MemoNonVars
              ((MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf> *)0x806e87);
    __cxa_atexit(MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::~MemoNonVars,&evaluate::memo,
                 &__dso_handle);
    __cxa_guard_release(&evaluate(Kernel::PolyNf)::memo);
  }
  Lib::
  BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_std::tuple<>,_Lib::ReturnNone<Kernel::PolyNf>,_Lib::Memo::None<Kernel::PolyNf,_Kernel::PolyNf>,_std::tuple<>_>
  ::BottomUpEvaluation(in_RDI);
  Lib::
  BottomUpEvaluation<Kernel::PolyNf,Kernel::PolyNf,std::tuple<>,Lib::ReturnNone<Kernel::PolyNf>,Lib::Memo::None<Kernel::PolyNf,Kernel::PolyNf>,std::tuple<>>
  ::function<Inferences::PolynomialEvaluation::evaluate(Kernel::PolyNf)const::__0>
            ((BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_std::tuple<>,_Lib::ReturnNone<Kernel::PolyNf>,_Lib::Memo::None<Kernel::PolyNf,_Kernel::PolyNf>,_std::tuple<>_>
              *)&stack0xffffffffffffff9e);
  Lib::
  BottomUpEvaluation<Kernel::PolyNf,Kernel::PolyNf,Inferences::PolynomialEvaluation::evaluate(Kernel::PolyNf)const::$_0,Lib::ReturnNone<Kernel::PolyNf>,Lib::Memo::None<Kernel::PolyNf,Kernel::PolyNf>,std::tuple<>>
  ::memo<MemoNonVars<Kernel::PolyNf,Kernel::PolyNf>&>
            ((BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_Lib::Memo::None<Kernel::PolyNf,_Kernel::PolyNf>,_std::tuple<>_>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  Lib::
  BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PolynomialEvaluation.cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
  ::apply(in_stack_00000268,in_stack_00000260);
  condition = false;
  Kernel::operator!=(in_RDX,in_stack_ffffffffffffff68);
  Lib::someIf<Inferences::PolynomialEvaluation::evaluate(Kernel::PolyNf)const::__1>
            (condition,in_stack_ffffffffffffff98);
  return (Option<Kernel::PolyNf> *)in_RDI;
}

Assistant:

Option<PolyNf> PolynomialEvaluation::evaluate(PolyNf normalized) const 
{
  static MemoNonVars<PolyNf, PolyNf> memo;
  auto out = BottomUpEvaluation<PolyNf, PolyNf>()
    .function(
        [&](PolyNf orig, PolyNf* ts) -> PolyNf 
        { 
          return orig.match(
              [&](Perfect<FuncTerm> f)
              { 
                return f->function().tryInterpret()
                  .andThen( [&](Theory::Interpretation && i)  -> Option<PolyNf>
                    { return trySimplify(i, ts); })
                  .unwrapOrElse([&]() -> PolyNf
                    { return PolyNf(perfect(FuncTerm(f->function(), ts))); });

              }, 

              [&](Variable v) 
              { return PolyNf(v); },

              [&](AnyPoly p) 
              { return PolyNf(simplifyPoly(p, ts, /*removeZeros=*/true)); }
          );
        })
    .memo<decltype(memo)&>(memo)
    .apply(normalized);
  auto outOpt = someIf(out != normalized, [&]() { return out; });
  DEBUG("evaluated ", normalized, " ==> ", outOpt)
  return outOpt;
}